

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

int Saig_ManFilterUsingIndOne_new
              (Aig_Man_t *p,Aig_Man_t *pFrame,sat_solver *pSat,Cnf_Dat_t *pCnf,int nConfs,int nProps
              ,int Counter)

{
  int *piVar1;
  int iVar2;
  lit local_44;
  int status;
  int Lit;
  Aig_Obj_t *pObj;
  int nProps_local;
  int nConfs_local;
  Cnf_Dat_t *pCnf_local;
  sat_solver *pSat_local;
  Aig_Man_t *pFrame_local;
  Aig_Man_t *p_local;
  
  pObj._0_4_ = nProps;
  pObj._4_4_ = nConfs;
  _nProps_local = pCnf;
  pCnf_local = (Cnf_Dat_t *)pSat;
  pSat_local = (sat_solver *)pFrame;
  pFrame_local = p;
  _status = Aig_ManCo(pFrame,Counter);
  piVar1 = _nProps_local->pVarNums;
  iVar2 = Aig_ObjId(_status);
  local_44 = toLitCond(piVar1[iVar2],0);
  iVar2 = sat_solver_solve((sat_solver *)pCnf_local,&local_44,&status,(long)pObj._4_4_,0,0,0);
  if (iVar2 == -1) {
    p_local._4_4_ = 1;
  }
  else if (iVar2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    if (iVar2 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigConstr2.c"
                    ,0x146,
                    "int Saig_ManFilterUsingIndOne_new(Aig_Man_t *, Aig_Man_t *, sat_solver *, Cnf_Dat_t *, int, int, int)"
                   );
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManFilterUsingIndOne_new( Aig_Man_t * p, Aig_Man_t * pFrame, sat_solver * pSat, Cnf_Dat_t * pCnf, int nConfs, int nProps, int Counter )
{
    Aig_Obj_t * pObj;
    int Lit, status;
    pObj = Aig_ManCo( pFrame, Counter );
    Lit  = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
        return 1;
    if ( status == l_Undef )
    {
//        printf( "Solver returned undecided.\n" );
        return 0;
    }
    assert( status == l_True );
    return 0;
}